

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall aggreports::LoadReturnPeriods(aggreports *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  long lVar2;
  undefined8 in_RAX;
  FILE *pFVar3;
  size_t sVar4;
  mapped_type_conflict *pmVar5;
  char *pcVar6;
  int return_period;
  allocator aStack_a1;
  string sStack_a0;
  string sStack_80;
  mapped_type_conflict mStack_60;
  key_type kStack_54;
  mapped_type_conflict mStack_50;
  aggreports *paStack_48;
  undefined8 uStack_28;
  
  if (this->useReturnPeriodFile_ != false) {
    pcVar6 = "input/returnperiods.bin";
    uStack_28 = in_RAX;
    pFVar3 = fopen("input/returnperiods.bin","rb");
    if (pFVar3 == (FILE *)0x0) {
      LoadReturnPeriods();
      paStack_48 = this;
      pFVar3 = fopen("input/periods.bin","rb");
      if (pFVar3 != (FILE *)0x0) {
        sVar4 = fread(&kStack_54,0xc,1,pFVar3);
        if (sVar4 != 0) {
          do {
            mStack_60 = mStack_50;
            pmVar5 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)(pcVar6 + 0xc0),&kStack_54);
            *pmVar5 = mStack_60;
            sVar4 = fread(&kStack_54,0xc,1,pFVar3);
          } while (sVar4 != 0);
        }
        if ((*(char *)(*(long *)(pcVar6 + 0x50) + 3) != '\0') ||
           (*(char *)(*(long *)(pcVar6 + 0x50) + 7) == '\x01')) {
          if ((*(long *)(pcVar6 + 0xe8) == 0) || (pcVar6[0x48] != '\0')) {
            if ((*(long *)(pcVar6 + 0xe8) != 0) && (pcVar6[0x58] == '\x01')) {
              std::__cxx11::string::string
                        ((string *)&sStack_80,*(char **)(pcVar6 + 0x68),&aStack_a1);
              sStack_a0._M_dataplus._M_p = (pointer)&sStack_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a0,"INFO","");
              logprintf(&sStack_80,&sStack_a0,
                        "Tail Value at Risk for Wheatsheaf mean/per sample mean is not supported if you wish to use non-uniform period weights..\n"
                       );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
                operator_delete(sStack_a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
                operator_delete(sStack_80._M_dataplus._M_p);
              }
            }
          }
          else {
            std::__cxx11::string::string((string *)&sStack_80,*(char **)(pcVar6 + 0x68),&aStack_a1);
            paVar1 = &sStack_a0.field_2;
            sStack_a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a0,"WARNING","");
            logprintf(&sStack_80,&sStack_a0,
                      "Return periods file must be present if you wish to use non-uniform period weights for Wheatsheaf mean/per sample mean output.\n"
                     );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_a0._M_dataplus._M_p != paVar1) {
              operator_delete(sStack_a0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
              operator_delete(sStack_80._M_dataplus._M_p);
            }
            std::__cxx11::string::string((string *)&sStack_80,*(char **)(pcVar6 + 0x68),&aStack_a1);
            sStack_a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a0,"INFO","");
            logprintf(&sStack_80,&sStack_a0,
                      "Wheatsheaf mean/per sample mean output will not be produced.\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_a0._M_dataplus._M_p != paVar1) {
              operator_delete(sStack_a0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
              operator_delete(sStack_80._M_dataplus._M_p);
            }
            lVar2 = *(long *)(pcVar6 + 0x50);
            *(undefined1 *)(lVar2 + 3) = 0;
            *(undefined1 *)(lVar2 + 7) = 0;
          }
        }
      }
      return;
    }
    sVar4 = fread((void *)((long)&uStack_28 + 4),4,1,pFVar3);
    if (sVar4 == 1) {
      do {
        __position._M_current =
             (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->returnperiods_,__position,
                     (int *)((long)&uStack_28 + 4));
        }
        else {
          *__position._M_current = uStack_28._4_4_;
          (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        sVar4 = fread((int *)((long)&uStack_28 + 4),4,1,pFVar3);
      } while (sVar4 == 1);
    }
    fclose(pFVar3);
    if ((this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      LoadReturnPeriods((aggreports *)&this->useReturnPeriodFile_);
    }
  }
  return;
}

Assistant:

void aggreports::LoadReturnPeriods() {

  if (useReturnPeriodFile_ == false) return;

  FILE *fin = fopen(RETURNPERIODS_FILE, "rb");
  if (fin == nullptr) {
    fprintf(stderr, "FATAL: Error opening file %s\n", RETURNPERIODS_FILE);
    exit(EXIT_FAILURE);
  }

  int return_period;
  while (fread(&return_period, sizeof(return_period), 1, fin) == 1) {
    returnperiods_.push_back(return_period);
  }

  fclose(fin);

  if (returnperiods_.size() == 0) {
    useReturnPeriodFile_ = false;
    fprintf(stderr, "WARNING: Empty return periods file. Running without "
		    "defined return periods option\n");
  }

}